

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O0

int aura_start_call(aura_node *node,char *name,
                   _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg,...)

{
  char in_AL;
  aura_object *o_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_64;
  aura_buffer *paStack_60;
  int ret;
  aura_buffer *buf;
  va_list ap;
  aura_object *o;
  void *arg_local;
  _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb_local;
  char *name_local;
  aura_node *node_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_f8 = in_R8;
  local_f0 = in_R9;
  o_00 = aura_etable_find(node->tbl,name);
  if (o_00 == (aura_object *)0x0) {
    node_local._4_4_ = -2;
  }
  else {
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    buf._4_4_ = 0x30;
    buf._0_4_ = 0x20;
    paStack_60 = aura_serialize(node,o_00->arg_fmt,o_00->arglen,(__va_list_tag *)&buf);
    if (paStack_60 == (aura_buffer *)0x0) {
      node_local._4_4_ = -0x3d;
    }
    else {
      local_64 = aura_core_start_call(node,o_00,calldonecb,arg,paStack_60);
      if (local_64 != 0) {
        aura_buffer_release(paStack_60);
      }
      node_local._4_4_ = local_64;
    }
  }
  return node_local._4_4_;
}

Assistant:

int aura_start_call(
	struct aura_node *node,
	const char *name,
	void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
	void *arg,
	...)
{
	struct aura_object *o;
	va_list ap;
	struct aura_buffer *buf;
	int ret;

	o = aura_etable_find(node->tbl, name);
	if (!o)
		return -ENOENT;

	va_start(ap, arg);
	buf = aura_serialize(node, o->arg_fmt, o->arglen, ap);
	va_end(ap);
	if (!buf)
		return -ENODATA;

	ret = aura_core_start_call(node, o, calldonecb, arg, buf);

	if (ret != 0)
		aura_buffer_release(buf);

	return ret;
}